

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::allowed_actions_to_label
               (search_private *priv,size_t ec_cnt,action *allowed_actions,
               size_t allowed_actions_cnt,float *allowed_actions_cost,action *oracle_actions,
               size_t oracle_actions_cnt,polylabel *lab)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  action aVar6;
  uint32_t uVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  float fVar12;
  cb_class local_48;
  size_t local_38;
  
  bVar1 = priv->cb_learner;
  local_38 = allowed_actions_cnt;
  if (priv->is_ldf == true) {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    if (ec_cnt == 0) {
      return;
    }
    uVar4 = 0;
    do {
      local_48.cost = 1.0;
      aVar6 = (action)uVar4;
      if (oracle_actions_cnt != 0 && oracle_actions != (action *)0x0) {
        sVar3 = 0;
        do {
          if (oracle_actions[sVar3] == aVar6) {
            local_48.cost = 0.0;
            goto LAB_0024e500;
          }
          sVar3 = sVar3 + 1;
        } while (oracle_actions_cnt != sVar3);
        local_48.cost = 1.0;
      }
LAB_0024e500:
      local_48.action = aVar6;
      if (bVar1 == false) {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back
                  ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_48);
      }
      else {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_48);
      }
      uVar4 = (ulong)(aVar6 + 1);
      if (ec_cnt <= uVar4) {
        return;
      }
    } while( true );
  }
  if (priv->use_action_costs == true) {
    if (allowed_actions == (action *)0x0) {
      uVar4 = (long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4;
      if (uVar4 != priv->A) {
        if (bVar1 == false) {
          v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
        }
        else {
          v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
        }
        if (priv->A == 0) {
          return;
        }
        uVar9 = 1;
        do {
          uVar7 = (uint32_t)uVar9;
          local_48.action = uVar7;
          if (bVar1 == false) {
            local_48.cost = 0.0;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_48);
          }
          else {
            local_48.cost = 0.0;
            local_48.probability = 0.0;
            local_48.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_48);
          }
          uVar4 = priv->A;
          bVar11 = uVar9 < uVar4;
          uVar9 = (ulong)(uVar7 + 1);
        } while (bVar11);
      }
      if (uVar4 == 0) {
        return;
      }
      uVar2 = 1;
      uVar4 = 0;
      do {
        (lab->cs).costs._begin[uVar4].x = allowed_actions_cost[uVar4];
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar4 < priv->A);
      return;
    }
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    sVar3 = local_38;
    if (local_38 == 0) {
      return;
    }
    uVar4 = 0;
    uVar9 = 1;
    do {
      local_48.action = allowed_actions[uVar4];
      local_48.cost = allowed_actions_cost[uVar4];
      if (bVar1 == false) {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back
                  ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_48);
      }
      else {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_48);
      }
      bVar11 = uVar9 < sVar3;
      uVar4 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar11);
    return;
  }
  if (allowed_actions != (action *)0x0 && allowed_actions_cnt != 0) {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    sVar3 = local_38;
    sVar10 = 0;
    do {
      local_48.action = allowed_actions[sVar10];
      local_48.cost = 1.0;
      if (oracle_actions_cnt != 0 && oracle_actions != (action *)0x0) {
        sVar5 = 0;
        do {
          if (oracle_actions[sVar5] == local_48.action) {
            local_48.cost = 0.0;
            goto LAB_0024e6ae;
          }
          sVar5 = sVar5 + 1;
        } while (oracle_actions_cnt != sVar5);
        local_48.cost = 1.0;
      }
LAB_0024e6ae:
      if (bVar1 == false) {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back
                  ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_48);
      }
      else {
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_48);
      }
      sVar10 = sVar10 + 1;
      if (sVar10 == sVar3) {
        return;
      }
    } while( true );
  }
  uVar9 = (long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4;
  local_38 = priv->A;
  uVar4 = uVar9;
  if (uVar9 != local_38) {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    if (priv->A == 0) goto joined_r0x0024e7b4;
    uVar8 = 1;
    do {
      uVar7 = (uint32_t)uVar8;
      local_48.action = uVar7;
      if (bVar1 == false) {
        local_48.cost = 1.0;
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back
                  ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_48);
      }
      else {
        local_48.cost = 1.0;
        local_48.probability = 0.0;
        local_48.partial_prediction = 0.0;
        v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_48);
      }
      uVar4 = priv->A;
      bVar11 = uVar8 < uVar4;
      uVar8 = (ulong)(uVar7 + 1);
    } while (bVar11);
  }
  if (1 < oracle_actions_cnt) {
    if (uVar4 == 0) {
      return;
    }
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      fVar12 = 1.0;
      if (oracle_actions != (action *)0x0) {
        sVar3 = 0;
        do {
          if (oracle_actions[sVar3] == uVar2) {
            fVar12 = 0.0;
            goto LAB_0024e7f6;
          }
          sVar3 = sVar3 + 1;
        } while (oracle_actions_cnt != sVar3);
        fVar12 = 1.0;
      }
LAB_0024e7f6:
      (lab->cs).costs._begin[uVar4].x = fVar12;
      uVar4 = (ulong)uVar2;
      if (priv->A <= uVar4) {
        return;
      }
    } while( true );
  }
  if (uVar4 != 0 && uVar9 == local_38) {
    uVar2 = 1;
    uVar4 = 0;
    do {
      (lab->cs).costs._begin[uVar4].x = 1.0;
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar4 < priv->A);
  }
joined_r0x0024e7b4:
  if (oracle_actions_cnt == 1) {
    (lab->cs).costs._begin[*oracle_actions - 1].x = 0.0;
  }
  return;
}

Assistant:

void allowed_actions_to_label(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, const action* oracle_actions,
    size_t oracle_actions_cnt, polylabel& lab)
{
  bool isCB = priv.cb_learner;
  if (priv.is_ldf)  // LDF version easier
  {
    cs_costs_erase(isCB, lab);
    for (action k = 0; k < ec_cnt; k++)
      cs_cost_push_back(isCB, lab, k, array_contains<action>(k, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
    // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index << ':'
    // << lab.cs.costs[i].x; cdbg << " ]" << endl;
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, lab);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, lab, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      bool set_to_one = false;
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 1.);
        set_to_one = true;
      }
      // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index <<
      // ':' << lab.cs.costs[i].x; cdbg << " ]" << endl;
      if (oracle_actions_cnt <= 1)  // common case to speed up
      {
        if (!set_to_one)
          for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, 1.);
        if (oracle_actions_cnt == 1)
          cs_set_cost_loss(isCB, lab, oracle_actions[0] - 1, 0.);
      }
      else
      {
        for (action k = 0; k < priv.A; k++)
          cs_set_cost_loss(isCB, lab, k, array_contains<action>(k + 1, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
      }
    }
    else  // only some actions are allowed
    {
      cs_costs_erase(isCB, lab);
      float w = 1.;  // array_contains<action>(3, oracle_actions, oracle_actions_cnt) ? 5.f : 1.f;
      for (size_t i = 0; i < allowed_actions_cnt; i++)
      {
        action k = allowed_actions[i];
        cs_cost_push_back(
            isCB, lab, k, (array_contains<action>(k, oracle_actions, oracle_actions_cnt)) ? 0.f : w);  // 1.f );
      }
    }
  }
}